

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedUnsizedArrayLength2::Run(AdvancedUnsizedArrayLength2 *this)

{
  CallLogWrapper *this_00;
  int *piVar1;
  GLuint buffer;
  bool bVar2;
  int i;
  GLuint GVar3;
  int iVar4;
  long lVar5;
  undefined4 *puVar6;
  void *pvVar7;
  long lVar8;
  int stagept;
  int stagept_00;
  byte bVar9;
  GLintptr offset;
  int i_1;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int sizes [8];
  GLint minA;
  int bufsize [8] [2];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  GLint blocksC;
  allocator_type local_d9;
  string local_d8;
  int local_ac;
  string local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  GLuint *local_68;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> local_60;
  int local_44;
  value_type local_40;
  
  (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[9]
  )();
  if ((this->stage == 0) &&
     (bVar2 = ShaderStorageBufferObjectBase::SupportedInVS
                        (&this->super_ShaderStorageBufferObjectBase,8), !bVar2)) {
    return 0x10;
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90db,&local_44);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90df,&local_ac);
  if (local_44 < 8) {
    return 0x10;
  }
  if (this->stage == 1) {
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShaderPT_abi_cxx11_
              (&local_a8,(void *)0x0,stagept);
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
              (&local_d8,this);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_a8,&local_d8);
LAB_0096ff3f:
    this->m_program = GVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (this->stage == 0) {
      gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
                (&local_a8,this);
      gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShaderPT_abi_cxx11_
                (&local_d8,&DAT_00000001,stagept_00);
      GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                        (&this->super_ShaderStorageBufferObjectBase,&local_a8,&local_d8);
      goto LAB_0096ff3f;
    }
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
              (&local_a8,this);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,&local_a8);
    this->m_program = GVar3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (!bVar2) {
    return -1;
  }
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  local_68 = this->m_storage_buffer;
  glu::CallLogWrapper::glGenBuffers(this_00,8,local_68);
  local_d8.field_2._M_allocated_capacity = 0x7b00000017;
  local_d8.field_2._8_8_ = 0x8000001a3;
  local_d8._M_dataplus._M_p = (pointer)0x500000007;
  local_d8._M_string_length = 0x400000003;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_a8.field_2._M_allocated_capacity = 0;
  local_a8.field_2._8_8_ = 0;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  lVar5 = 0;
  do {
    local_40.m_data[lVar5] = 0x29;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&local_60,100000,&local_40,&local_d9);
  lVar5 = 0;
  GVar3 = 0;
  do {
    if (this->layout == 0) {
      iVar4 = this->etype;
      *(int *)((long)&local_a8._M_dataplus._M_p + lVar5 * 2 + 4) =
           *(int *)(&DAT_01a8a6d0 + (long)iVar4 * 0x20 + lVar5) << 4;
      if ((long)iVar4 == 3) {
        puVar6 = (undefined4 *)&DAT_01a99b60;
LAB_009700d0:
        iVar4 = *(int *)(lVar5 + (long)puVar6);
        goto LAB_009700eb;
      }
    }
    else if (this->layout == 1) {
      iVar4 = this->etype;
      lVar8 = (long)iVar4 * 0x20 + lVar5;
      *(int *)((long)&local_a8._M_dataplus._M_p + lVar5 * 2 + 4) =
           *(int *)(&DAT_01a8a6d0 + lVar8) * *(int *)(&DAT_01a8a750 + lVar8) * 4;
      if ((long)iVar4 == 3) {
        puVar6 = &DAT_01a99b40;
        goto LAB_009700d0;
      }
    }
    else {
      iVar4 = *(int *)(&DAT_01a8a7d0 + (long)this->etype * 0x20 + lVar5);
LAB_009700eb:
      *(int *)((long)&local_a8._M_dataplus._M_p + lVar5 * 2 + 4) = iVar4 << 2;
    }
    iVar4 = *(int *)((long)&local_d8._M_dataplus._M_p + lVar5);
    iVar12 = *(int *)((long)&local_a8._M_dataplus._M_p + lVar5 * 2 + 4);
    iVar10 = iVar12 * iVar4;
    *(int *)((long)&local_a8._M_dataplus._M_p + lVar5 * 2) = iVar10;
    buffer = *(GLuint *)((long)this->m_storage_buffer + lVar5);
    if ((lVar5 == 0x1c) || (this->bind_seq == 0)) {
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,GVar3,buffer);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,(long)iVar10,
                 local_60.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,0x88ea);
    }
    else {
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,buffer);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,(long)iVar10,
                 local_60.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,0x88ea);
      if (this->bind_seq == 2) {
        if (iVar12 * 2 < local_ac) goto LAB_009701bb;
        offset = (GLintptr)(iVar12 * 2);
        iVar12 = iVar10 + iVar12 * -2;
      }
      else {
        if (this->bind_seq == 1) {
          glu::CallLogWrapper::glBindBufferBase
                    (this_00,0x90d2,GVar3,*(GLuint *)((long)local_68 + lVar5));
          goto LAB_009701f1;
        }
LAB_009701bb:
        iVar12 = (iVar4 + -2) * iVar12;
        offset = 0;
      }
      glu::CallLogWrapper::glBindBufferRange
                (this_00,0x90d2,GVar3,*(GLuint *)((long)local_68 + lVar5),offset,(long)iVar12);
    }
LAB_009701f1:
    GVar3 = GVar3 + 1;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x20);
  if (this->stage == 2) {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  else {
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
  }
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[7]);
  pvVar7 = glu::CallLogWrapper::glMapBufferRange
                     (this_00,0x90d2,0,(long)(int)(local_d8.field_2._12_4_ << 2),1);
  lVar5 = -1;
  if (pvVar7 == (void *)0x0) goto LAB_0097048e;
  bVar9 = 1;
  uVar11 = 0;
  do {
    if (this->other_members == true) {
      piVar1 = (int *)((long)&local_d8._M_dataplus._M_p + uVar11 * 4);
      *piVar1 = *piVar1 + -1;
    }
    if ((this->bind_seq & 0xfffffffeU) == 2) {
      piVar1 = (int *)((long)&local_d8._M_dataplus._M_p + uVar11 * 4);
      *piVar1 = *piVar1 + -2;
    }
    if (((uint)this->layout < 2) &&
       (*(int *)((long)pvVar7 + uVar11 * 4) !=
        *(int *)((long)&local_d8._M_dataplus._M_p + uVar11 * 4))) {
      bVar9 = 0;
      anon_unknown_0::Output("Array %d length is %d should be %d.\n",uVar11 & 0xffffffff);
    }
    if (((this->layout & 0xfffffffeU) == 2) &&
       (*(int *)((long)&local_d8._M_dataplus._M_p + uVar11 * 4) <
        *(int *)((long)pvVar7 + uVar11 * 4))) {
      bVar9 = 0;
      anon_unknown_0::Output
                ("Array %d length is %d should be not greater that %d.\n",uVar11 & 0xffffffff);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 7);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  if (this->length_as_index == true) {
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[4]);
    pvVar7 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,(long)(int)local_88,1);
    if (pvVar7 == (void *)0x0) goto LAB_0097048e;
    lVar8 = (long)this->etype * 0x20;
    if (*(int *)((long)pvVar7 +
                (long)((local_d8.field_2._M_allocated_capacity._0_4_ + -2) *
                       *(int *)(&DAT_01a8a6e0 + lVar8) * *(int *)(&DAT_01a8a760 + lVar8)) * 4) !=
        0x52) {
      bVar9 = 0;
      anon_unknown_0::Output("Array 4 index %d is %d should be 82.\n");
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[6]);
    pvVar7 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,(long)(int)local_78,1);
    if (pvVar7 != (void *)0x0) {
      lVar8 = (long)this->etype * 0x20;
      if (*(int *)((long)pvVar7 +
                  (long)((local_d8.field_2._8_4_ + -2) * *(int *)(&DAT_01a8a6e8 + lVar8) *
                        *(int *)(&DAT_01a8a768 + lVar8)) * 4) != 0x52) {
        bVar9 = 0;
        anon_unknown_0::Output("Array 6 index %d is %d should be 82.\n");
      }
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    }
    if (pvVar7 == (void *)0x0) goto LAB_0097048e;
  }
  lVar5 = -(ulong)(~bVar9 & 1);
LAB_0097048e:
  if (local_60.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		const int kSize = 100000;
		const int kBufs = 8;
		SetPath();
		if (stage == vertex && !SupportedInVS(8))
			return NOT_SUPPORTED;
		GLint blocksC;
		glGetIntegerv(GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS, &blocksC);
		GLint minA;
		glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &minA);
		if (blocksC < kBufs)
			return NOT_SUPPORTED;
		if (stage == vertex)
		{
			std::string glsl_vs = BuildShader();
			std::string glsl_fs = BuildShaderPT(fragment);
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else if (stage == fragment)
		{
			std::string glsl_vs = BuildShaderPT(vertex);
			std::string glsl_fs = BuildShader();
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else
		{ // compute
			std::string glsl_cs = BuildShader();
			m_program			= CreateProgramCS(glsl_cs);
		}
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;
		glUseProgram(m_program);

		glGenBuffers(kBufs, m_storage_buffer);
		int sizes[kBufs] = { 7, 5, 3, 4, 23, 123, 419, 8 };

		int columns[4][kBufs] = { { 1, 1, 1, 1, 1, 1, 1, 1 },   // vector: 1 col
								  { 2, 3, 4, 4, 2, 3, 4, 1 },   // mat: # of cols
								  { 2, 3, 4, 4, 3, 2, 2, 1 },   // RM mat: # of rows
								  { 1, 1, 1, 1, 1, 1, 1, 1 } }; // structure: not used

		int scalars[4][kBufs] = { { 4, 4, 4, 4, 2, 2, 4, 1 },   //vector: size
								  { 2, 4, 4, 4, 4, 2, 2, 1 },   //matrix column_major: rows
								  { 2, 4, 4, 4, 2, 4, 4, 1 },   //matrix row_major: columns
								  { 1, 1, 1, 1, 1, 1, 1, 1 } }; //structure: not used

		int mindw[4][kBufs] = { { 3, 4, 3, 3, 2, 2, 4, 1 }, // # of real 32bit items
								{ 4, 9, 16, 16, 6, 6, 8, 1 },
								{ 4, 9, 16, 16, 6, 6, 8, 1 },
								{ 4, 11, 35, 35, 81, 127, 381, 1 } };
		int std430struct[kBufs] = { 4, 16, 48, 48, 88, 68, 264, 1 };
		int std140struct[kBufs] = { 4, 16, 60, 60, 144, 80, 432, 1 };
		int bufsize[kBufs][2]   = { { 0 } };

		std::vector<ivec4> data(kSize, ivec4(41));
		for (int i = 0; i < kBufs; ++i)
		{
			if (layout == std430)
			{
				bufsize[i][1] = 4 * columns[etype][i] * scalars[etype][i];
				if (etype == structure)
				{
					bufsize[i][1] = 4 * std430struct[i];
				}
			}
			else if (layout == std140)
			{
				bufsize[i][1] = 4 * columns[etype][i] * 4;
				if (etype == structure)
				{
					bufsize[i][1] = 4 * std140struct[i];
				}
			}
			else
			{
				bufsize[i][1] = 4 * mindw[etype][i];
			}
			bufsize[i][0] = sizes[i] * bufsize[i][1];
			if (i == kBufs - 1 || bind_seq == bindbasebefore)
			{ // never trim feedback storage
				glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
				glBufferData(GL_SHADER_STORAGE_BUFFER, bufsize[i][0], &data[0], GL_DYNAMIC_COPY);
			}
			else
			{
				glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[i]);
				glBufferData(GL_SHADER_STORAGE_BUFFER, bufsize[i][0], &data[0], GL_DYNAMIC_COPY);
				if (bind_seq == bindbaseafter)
				{
					glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
				}
				else if (bind_seq == bindrangeoffset && 2 * bufsize[i][1] >= minA)
				{
					glBindBufferRange(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i], 2 * bufsize[i][1],
									  bufsize[i][0] - 2 * bufsize[i][1]); // without 2 elements
				}
				else
				{ // bind_seq == bindrangesize || 2*bufsize[i][1] < minA
					glBindBufferRange(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i], 0,
									  bufsize[i][0] - 2 * bufsize[i][1]); // without 2 elements
				}
			}
		}

		if (stage != compute)
		{
			glGenVertexArrays(1, &m_vertex_array);
			glBindVertexArray(m_vertex_array);
			glDrawArrays(GL_POINTS, 0, 1);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[kBufs - 1]);
		int* dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * sizes[kBufs - 1], GL_MAP_READ_BIT);
		if (!dataout)
			return ERROR;
		bool status = true;
		for (int i = 0; i < kBufs - 1; ++i)
		{
			if (other_members)
				sizes[i] -= 1; // space consumed by a pad
			if (bind_seq == bindrangesize || bind_seq == bindrangeoffset)
				sizes[i] -= 2; // space constrained by offset of range size
			if ((layout == std140 || layout == std430) && dataout[i] != sizes[i])
			{
				Output("Array %d length is %d should be %d.\n", i, dataout[i], sizes[i]);
				status = false;
			}
			if ((layout == packed || layout == shared) && (dataout[i] > sizes[i]))
			{
				Output("Array %d length is %d should be not greater that %d.\n", i, dataout[i], sizes[i]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		if (length_as_index)
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
			dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufsize[4][0], GL_MAP_READ_BIT);
			if (!dataout)
				return ERROR;
			int i = (sizes[4] - 2) * columns[etype][4] * scalars[etype][4];
			if (dataout[i] != 82)
			{
				Output("Array 4 index %d is %d should be 82.\n", i, dataout[i]);
				status = false;
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[6]);
			dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufsize[6][0], GL_MAP_READ_BIT);
			if (!dataout)
				return ERROR;
			i = (sizes[6] - 2) * columns[etype][6] * scalars[etype][6];
			if (dataout[i] != 82)
			{
				Output("Array 6 index %d is %d should be 82.\n", i, dataout[i]);
				status = false;
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}

		if (!status)
			return ERROR;

		return NO_ERROR;
	}